

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

aiLogStream aiGetPredefinedLogStream(aiDefaultLogStream pStream,char *file)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  code *pcVar3;
  aiLogStream aVar4;
  
  p_Var1 = (_List_node_base *)Assimp::LogStream::createDefaultStream(pStream,file,(IOSystem *)0x0);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  pcVar3 = CallbackToLogRedirector;
  if (p_Var1 == (_List_node_base *)0x0) {
    pcVar3 = (aiLogStreamCallback)0x0;
  }
  p_Var2[1]._M_next = p_Var1;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  _DAT_009e0e38 = _DAT_009e0e38 + 1;
  aVar4.user = (char *)p_Var1;
  aVar4.callback = pcVar3;
  return aVar4;
}

Assistant:

ASSIMP_API aiLogStream aiGetPredefinedLogStream(aiDefaultLogStream pStream,const char* file)
{
    aiLogStream sout;

    ASSIMP_BEGIN_EXCEPTION_REGION();
    LogStream* stream = LogStream::createDefaultStream(pStream,file);
    if (!stream) {
        sout.callback = NULL;
        sout.user = NULL;
    }
    else {
        sout.callback = &CallbackToLogRedirector;
        sout.user = (char*)stream;
    }
    gPredefinedStreams.push_back(stream);
    ASSIMP_END_EXCEPTION_REGION(aiLogStream);
    return sout;
}